

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O3

BufferHandle * __thiscall
duckdb::CachingFileHandle::TryInsertFileRange
          (BufferHandle *__return_storage_ptr__,CachingFileHandle *this,BufferHandle *pin,
          data_ptr_t *buffer,idx_t nr_bytes,idx_t location,
          shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *new_file_range)

{
  _Base_ptr *this_00;
  BufferHandle *__return_storage_ptr___00;
  CachedFile *pCVar1;
  ulong uVar2;
  ulong uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  CachedFileRange *pCVar9;
  type pCVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  mapped_type *pmVar13;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> *guard;
  const_iterator __position;
  _Rb_tree_header *p_Var14;
  ulong uVar15;
  idx_t nr_bytes_00;
  undefined1 local_70 [64];
  
  nr_bytes_00 = location;
  local_70._8_8_ = location;
  local_70._16_8_ = __return_storage_ptr__;
  local_70._32_8_ = buffer;
  shared_ptr<duckdb::StorageLockInternals,_true>::operator->(&(this->cached_file->lock).internals);
  StorageLockInternals::GetExclusiveLock((StorageLockInternals *)local_70);
  pCVar1 = this->cached_file;
  p_Var12 = (pCVar1->ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_70._24_8_ = this;
  if (p_Var12 != (_Base_ptr)0x0) {
    p_Var14 = &(pCVar1->ranges)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var14->_M_header;
    do {
      if (*(ulong *)(p_Var12 + 1) >= location) {
        __position._M_node = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < location];
    } while (p_Var12 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)__position._M_node != p_Var14) {
      __return_storage_ptr___00 = (BufferHandle *)(local_70 + 0x28);
      do {
        this_00 = &__position._M_node[1]._M_parent;
        pCVar9 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->
                           ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)this_00)
        ;
        pCVar10 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                            (new_file_range);
        if ((pCVar10->location < pCVar9->location) ||
           (pCVar9->location + pCVar9->nr_bytes < pCVar10->location + pCVar10->nr_bytes)) {
          pCVar9 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->
                             (new_file_range);
          pCVar10 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                              ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)
                               this_00);
          uVar2 = pCVar10->location;
          uVar3 = pCVar9->location;
          uVar15 = pCVar9->nr_bytes + uVar3;
          uVar11 = pCVar10->nr_bytes + uVar2;
          bVar7 = uVar2 < uVar15 && uVar3 < uVar11;
          cVar8 = '\x02';
          if (uVar15 < uVar11) {
            cVar8 = bVar7;
          }
          if (uVar2 < uVar3) {
            cVar8 = bVar7;
          }
          if (cVar8 == '\x02') goto LAB_01116d4d;
          if (cVar8 == '\0') break;
          p_Var12 = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
        }
        else {
          pCVar10 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                              ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)
                               this_00);
          TryReadFromFileRange
                    (__return_storage_ptr___00,(CachingFileHandle *)local_70._24_8_,guard,pCVar10,
                     (data_ptr_t *)local_70._32_8_,nr_bytes_00,local_70._8_8_);
          BufferHandle::operator=(pin,__return_storage_ptr___00);
          BufferHandle::~BufferHandle(__return_storage_ptr___00);
          bVar7 = BufferHandle::IsValid(pin);
          if (bVar7) goto LAB_01116daf;
LAB_01116d4d:
          p_Var12 = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
          ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
          ::_M_erase_aux(&(pCVar1->ranges)._M_t,__position);
        }
        __position._M_node = p_Var12;
      } while ((_Rb_tree_header *)p_Var12 != p_Var14);
    }
  }
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->(new_file_range);
  pmVar13 = ::std::
            map<unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
            ::operator[](&pCVar1->ranges,(key_type *)(local_70 + 8));
  peVar4 = (new_file_range->internal).
           super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var5 = (new_file_range->internal).
           super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (new_file_range->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (new_file_range->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (pmVar13->internal).
            super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (pmVar13->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar4;
  (pmVar13->internal).
  super___shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
LAB_01116daf:
  uVar6 = local_70._16_8_;
  BufferHandle::BufferHandle((BufferHandle *)local_70._16_8_,pin);
  if ((element_type *)local_70._0_8_ != (element_type *)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_70._0_8_);
    operator_delete((void *)local_70._0_8_);
  }
  return (BufferHandle *)uVar6;
}

Assistant:

BufferHandle CachingFileHandle::TryInsertFileRange(BufferHandle &pin, data_ptr_t &buffer, idx_t nr_bytes,
                                                   idx_t location, shared_ptr<CachedFileRange> &new_file_range) {
	// Grab the lock again (write lock this time) to insert the newly created buffer into the ranges
	auto guard = cached_file.lock.GetExclusiveLock();
	auto &ranges = cached_file.Ranges(guard);

	// Start at lower_bound (first range with location not less than location of newly created range)
	for (auto it = ranges.lower_bound(location); it != ranges.end();) {
		if (it->second->GetOverlap(*new_file_range) == CachedFileRangeOverlap::FULL) {
			// Another thread has read a range that fully contains the requested range in the meantime
			pin = TryReadFromFileRange(guard, *it->second, buffer, nr_bytes, location);
			if (pin.IsValid()) {
				return std::move(pin);
			}
			it = ranges.erase(it);
			continue;
		}
		// Check if the new range overlaps with a cached one
		bool break_loop = false;
		switch (new_file_range->GetOverlap(*it->second)) {
		case CachedFileRangeOverlap::NONE:
			break_loop = true; // We iterated past potential overlaps
			break;
		case CachedFileRangeOverlap::PARTIAL:
			break; // The newly created range does not fully contain this range, so it is still useful
		case CachedFileRangeOverlap::FULL:
			// Full overlap, this range will be obsolete when we insert the current one
			// Since we have the write lock here, we can do some cleanup
			it = ranges.erase(it);
			continue;
		}
		if (break_loop) {
			break;
		}
		++it;
	}

	// Finally, insert newly created buffer into the map
	new_file_range->AddCheckSum();
	ranges[location] = std::move(new_file_range);
	cached_file.Verify(guard);

	return std::move(pin);
}